

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

string * __thiscall
t_js_generator::js_namespace_abi_cxx11_
          (string *__return_storage_ptr__,t_js_generator *this,t_program *p)

{
  allocator local_31;
  string local_30;
  
  if (this->no_ns_ == true) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,"js",&local_31);
    t_program::get_namespace(__return_storage_ptr__,p,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string js_namespace(t_program* p) {
    if (no_ns_) {
      return "";
    }
    std::string ns = p->get_namespace("js");
    if (ns.size() > 0) {
      ns += ".";
    }

    return ns;
  }